

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

string * __thiscall
helics::CommonCore::getFederateTag_abi_cxx11_(CommonCore *this,LocalFederateId fid,string_view tag)

{
  FederateState *this_00;
  string *psVar1;
  InvalidIdentifier *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  long *in_FS_OFFSET;
  string_view message;
  string_view fmt;
  format_args args;
  string local_70;
  string *local_50;
  char *local_48;
  size_t local_40;
  
  this_00 = getFederateAt(this,fid);
  if (fid.fid == -0x103) {
    if (*(char *)(*in_FS_OFFSET + -0x13f8) == '\0') {
      getFederateTag_abi_cxx11_();
    }
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x6;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_48;
    local_48 = tag._M_str;
    local_40 = tag._M_len;
    ::fmt::v11::vformat_abi_cxx11_(&local_70,(v11 *)"tag/{}",fmt,args);
    (*(this->super_Core)._vptr_Core[0x5e])
              (&local_48,this,4,"core",local_70._M_string_length,local_70._M_dataplus._M_p,1);
    getFederateTag_abi_cxx11_();
    return local_50;
  }
  if (this_00 != (FederateState *)0x0) {
    psVar1 = FederateState::getTag_abi_cxx11_(this_00,tag);
    return psVar1;
  }
  this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
  message._M_str = "federateID not valid (getFederateTag)";
  message._M_len = 0x25;
  InvalidIdentifier::InvalidIdentifier(this_01,message);
  __cxa_throw(this_01,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
}

Assistant:

const std::string& CommonCore::getFederateTag(LocalFederateId fid, std::string_view tag) const
{
    auto* fed = getFederateAt(fid);
    if (fid == gLocalCoreId) {
        static thread_local std::string val;
        val = const_cast<CommonCore*>(this)->query(
            "core",
            fmt::format("tag/{}", tag),
            HelicsSequencingModes::HELICS_SEQUENCING_MODE_ORDERED);
        val = gmlc::utilities::stringOps::removeQuotes(val);
        return val;
    }
    if (fed == nullptr) {
        throw(InvalidIdentifier("federateID not valid (getFederateTag)"));
    }

    return fed->getTag(tag);
}